

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_function_expression.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::ExpressionBinder::BindUnnest
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,FunctionExpression *expr,
          idx_t depth,bool root_expression)

{
  string sStack_48;
  
  (*this->_vptr_ExpressionBinder[0xe])(&sStack_48);
  BindUnsupportedExpression
            (__return_storage_ptr__,this,&expr->super_ParsedExpression,depth,&sStack_48);
  ::std::__cxx11::string::~string((string *)&sStack_48);
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindUnnest(FunctionExpression &expr, idx_t depth, bool root_expression) {
	return BindUnsupportedExpression(expr, depth, UnsupportedUnnestMessage());
}